

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yv12config.c
# Opt level: O2

int aom_alloc_frame_buffer
              (YV12_BUFFER_CONFIG *ybf,int width,int height,int ss_x,int ss_y,int use_highbitdepth,
              int border,int byte_alignment,_Bool alloc_pyramid,int alloc_y_plane_only)

{
  int iVar1;
  
  if (ybf != (YV12_BUFFER_CONFIG *)0x0) {
    aom_free_frame_buffer(ybf);
    iVar1 = aom_realloc_frame_buffer
                      (ybf,width,height,ss_x,ss_y,use_highbitdepth,border,byte_alignment,
                       (aom_codec_frame_buffer_t *)0x0,(aom_get_frame_buffer_cb_fn_t)0x0,(void *)0x0
                       ,alloc_pyramid,alloc_y_plane_only);
    return iVar1;
  }
  return 2;
}

Assistant:

int aom_alloc_frame_buffer(YV12_BUFFER_CONFIG *ybf, int width, int height,
                           int ss_x, int ss_y, int use_highbitdepth, int border,
                           int byte_alignment, bool alloc_pyramid,
                           int alloc_y_plane_only) {
  if (ybf) {
    aom_free_frame_buffer(ybf);
    return aom_realloc_frame_buffer(
        ybf, width, height, ss_x, ss_y, use_highbitdepth, border,
        byte_alignment, NULL, NULL, NULL, alloc_pyramid, alloc_y_plane_only);
  }
  return AOM_CODEC_MEM_ERROR;
}